

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl_flats.cpp
# Opt level: O2

void __thiscall GLFlat::DrawSkyboxSector(GLFlat *this,int pass,bool processlights)

{
  line_t *plVar1;
  vertex_t *pvVar2;
  vertex_t *pvVar3;
  undefined1 auVar4 [16];
  ulong uVar5;
  ushort uVar6;
  int iVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  float local_48;
  float fStack_44;
  float local_38;
  float fStack_34;
  FQuadDrawer qd;
  
  uVar6 = this->sector->linecount;
  uVar5 = 0;
  if ((short)uVar6 < 1) {
    uVar6 = 0;
  }
  auVar13 = _DAT_0067aaf0;
  auVar14 = _DAT_0067aae0;
  for (; uVar6 != uVar5; uVar5 = uVar5 + 1) {
    plVar1 = this->sector->lines[uVar5];
    pvVar2 = plVar1->v1;
    pvVar3 = plVar1->v2;
    fVar8 = (float)(pvVar2->p).X;
    fVar9 = (float)(pvVar2->p).Y;
    auVar12._4_4_ = fVar9;
    auVar12._0_4_ = fVar8;
    auVar12._8_8_ = 0;
    auVar12 = maxps(auVar13,auVar12);
    fVar10 = (float)(pvVar3->p).X;
    fVar11 = (float)(pvVar3->p).Y;
    auVar13._4_4_ = fVar9;
    auVar13._0_4_ = fVar8;
    auVar13._8_8_ = 0;
    auVar13 = minps(auVar14,auVar13);
    auVar14._4_4_ = fVar11;
    auVar14._0_4_ = fVar10;
    auVar14._8_8_ = 0;
    auVar14 = minps(auVar13,auVar14);
    auVar4._4_4_ = fVar11;
    auVar4._0_4_ = fVar10;
    auVar4._8_8_ = 0;
    auVar13 = maxps(auVar12,auVar4);
  }
  fVar10 = (float)((double)this->dz + (this->plane).plane.negiC * (this->plane).plane.D);
  iVar7 = SUB84((double)((this->plane).Angle * 0.011111111) + 6755399441055744.0,0);
  FQuadDrawer::FQuadDrawer(&qd);
  uVar5 = (ulong)((-iVar7 & 3U) << 2);
  fVar8 = *(float *)((long)DrawSkyboxSector::uvals + uVar5);
  fVar9 = *(float *)((long)DrawSkyboxSector::vvals + uVar5);
  local_48 = auVar14._0_4_;
  fStack_44 = auVar14._4_4_;
  (qd.p)->x = local_48;
  (qd.p)->z = fVar10;
  (qd.p)->y = fStack_44;
  (qd.p)->u = fVar8;
  (qd.p)->v = fVar9;
  uVar5 = (ulong)((1U - iVar7 & 3) << 2);
  fVar8 = *(float *)((long)DrawSkyboxSector::uvals + uVar5);
  fVar9 = *(float *)((long)DrawSkyboxSector::vvals + uVar5);
  qd.p[1].x = local_48;
  qd.p[1].z = fVar10;
  local_38 = auVar13._0_4_;
  fStack_34 = auVar13._4_4_;
  qd.p[1].y = fStack_34;
  qd.p[1].u = fVar8;
  qd.p[1].v = fVar9;
  uVar5 = (ulong)((2U - iVar7 & 3) << 2);
  fVar8 = *(float *)((long)DrawSkyboxSector::uvals + uVar5);
  fVar9 = *(float *)((long)DrawSkyboxSector::vvals + uVar5);
  qd.p[2].x = local_38;
  qd.p[2].z = fVar10;
  qd.p[2].y = fStack_34;
  qd.p[2].u = fVar8;
  qd.p[2].v = fVar9;
  uVar5 = (ulong)((3U - iVar7 & 3) << 2);
  fVar8 = *(float *)((long)DrawSkyboxSector::uvals + uVar5);
  fVar9 = *(float *)((long)DrawSkyboxSector::vvals + uVar5);
  qd.p[3].x = local_38;
  qd.p[3].z = fVar10;
  qd.p[3].y = fStack_44;
  qd.p[3].u = fVar8;
  qd.p[3].v = fVar9;
  FQuadDrawer::Render(&qd,6);
  flatvertices = flatvertices + 4;
  flatprimitives = flatprimitives + 1;
  return;
}

Assistant:

void GLFlat::DrawSkyboxSector(int pass, bool processlights)
{

	float minx = FLT_MAX, miny = FLT_MAX;
	float maxx = -FLT_MAX, maxy = -FLT_MAX;

	for (int i = 0; i < sector->linecount; i++)
	{
		line_t *ln = sector->lines[i];
		float x = ln->v1->fX();
		float y = ln->v1->fY();
		if (x < minx) minx = x;
		if (y < miny) miny = y;
		if (x > maxx) maxx = x;
		if (y > maxy) maxy = y;
		x = ln->v2->fX();
		y = ln->v2->fY();
		if (x < minx) minx = x;
		if (y < miny) miny = y;
		if (x > maxx) maxx = x;
		if (y > maxy) maxy = y;
	}

	float z = plane.plane.ZatPoint(0., 0.) + dz;
	static float uvals[] = { 0, 0, 1, 1 };
	static float vvals[] = { 1, 0, 0, 1 };
	int rot = -xs_FloorToInt(plane.Angle / 90.f);

	FQuadDrawer qd;

	qd.Set(0, minx, z, miny, uvals[rot & 3], vvals[rot & 3]);
	qd.Set(1, minx, z, maxy, uvals[(rot + 1) & 3], vvals[(rot + 1) & 3]);
	qd.Set(2, maxx, z, maxy, uvals[(rot + 2) & 3], vvals[(rot + 2) & 3]);
	qd.Set(3, maxx, z, miny, uvals[(rot + 3) & 3], vvals[(rot + 3) & 3]);
	qd.Render(GL_TRIANGLE_FAN);

	flatvertices += 4;
	flatprimitives++;
}